

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

void __thiscall
cmCommandArgumentParserHelper::SetMakefile(cmCommandArgumentParserHelper *this,cmMakefile *mf)

{
  cmake *pcVar1;
  
  this->Makefile = mf;
  pcVar1 = cmMakefile::GetCMakeInstance(mf);
  this->WarnUninitialized = pcVar1->WarnUninitialized;
  pcVar1 = cmMakefile::GetCMakeInstance(mf);
  this->CheckSystemVars = pcVar1->CheckSystemVars;
  return;
}

Assistant:

void cmCommandArgumentParserHelper::SetMakefile(const cmMakefile* mf)
{
  this->Makefile = mf;
  this->WarnUninitialized = mf->GetCMakeInstance()->GetWarnUninitialized();
  this->CheckSystemVars = mf->GetCMakeInstance()->GetCheckSystemVars();
}